

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O1

int internal_verify(X509_STORE_CTX *ctx)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long in_RAX;
  size_t sVar6;
  X509 *x;
  X509 *a;
  EVP_PKEY *r;
  int64_t iVar7;
  ASN1_TIME *pAVar8;
  uint uVar9;
  int64_t ctm_time;
  long local_38;
  
  local_38 = in_RAX;
  sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
  iVar4 = (int)sVar6;
  uVar9 = iVar4 - 1;
  ctx->error_depth = uVar9;
  x = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,(long)(int)uVar9);
  iVar3 = x509_check_issued_with_callback(ctx,(X509 *)x,(X509 *)x);
  a = x;
  if (iVar3 == 0) {
    if ((ctx->param->flags & 0x80000) != 0) goto LAB_001b0e8e;
    if (1 < iVar4) {
      uVar5 = iVar4 - 2;
      ctx->error_depth = uVar5;
      goto LAB_001b0e15;
    }
    ctx->error = 0x15;
    ctx->current_cert = (X509 *)x;
    uVar9 = (*ctx->verify_cb)(0,ctx);
    if (1 < uVar9) {
LAB_001b0e10:
      abort();
    }
  }
  else {
    while (-1 < (int)uVar9) {
      ctx->error_depth = uVar9;
      if ((a != x) || ((ctx->param->flags & 0x4000) != 0)) {
        r = (EVP_PKEY *)X509_get0_pubkey((X509 *)x);
        if (r == (EVP_PKEY *)0x0) {
          ctx->error = 6;
          ctx->current_cert = (X509 *)x;
        }
        else {
          iVar4 = X509_verify(a,r);
          if (0 < iVar4) goto LAB_001b0e8e;
          ctx->error = 7;
          ctx->current_cert = (X509 *)a;
        }
        uVar5 = (*ctx->verify_cb)(0,ctx);
        if (1 < uVar5) goto LAB_001b0e10;
        if (uVar5 == 0) {
          return 0;
        }
      }
LAB_001b0e8e:
      uVar1 = ctx->param->flags;
      if (((uint)uVar1 >> 0x15 & 1) == 0) {
        if ((uVar1 & 2) == 0) {
          iVar7 = time((time_t *)0x0);
        }
        else {
          iVar7 = ctx->param->check_time;
        }
        pAVar8 = X509_get_notBefore((X509 *)a);
        iVar4 = ASN1_TIME_to_posix(pAVar8,&local_38);
        if (iVar4 == 0) {
          ctx->error = 0xd;
LAB_001b0ee1:
          ctx->current_cert = (X509 *)a;
          uVar5 = (*ctx->verify_cb)(0,ctx);
          if (1 < uVar5) goto LAB_001b0e10;
          if (uVar5 == 0) {
            return 0;
          }
        }
        else if (iVar7 < local_38) {
          ctx->error = 9;
          goto LAB_001b0ee1;
        }
        pAVar8 = X509_get_notAfter((X509 *)a);
        iVar4 = ASN1_TIME_to_posix(pAVar8,&local_38);
        bVar2 = local_38 <= iVar7;
        if (iVar4 == 0) {
          ctx->error = 0xe;
          ctx->current_cert = (X509 *)a;
          uVar5 = (*ctx->verify_cb)(0,ctx);
          if (1 < uVar5) goto LAB_001b0e10;
          if (uVar5 == 0) {
            return 0;
          }
        }
        if (bVar2 && iVar4 != 0) {
          ctx->error = 10;
          ctx->current_cert = (X509 *)a;
          uVar5 = (*ctx->verify_cb)(0,ctx);
          if (1 < uVar5) goto LAB_001b0e10;
          if (uVar5 == 0) {
            return 0;
          }
        }
      }
      ctx->current_cert = (X509 *)a;
      uVar5 = (*ctx->verify_cb)(1,ctx);
      if (1 < uVar5) goto LAB_001b0e10;
      if (uVar5 == 0) {
        return 0;
      }
      uVar5 = uVar9 - 1;
      bVar2 = 0 < (int)uVar9;
      uVar9 = uVar5;
      if (bVar2) {
LAB_001b0e15:
        x = a;
        a = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,(ulong)uVar5);
        uVar9 = uVar5;
      }
    }
    uVar9 = 1;
  }
  return uVar9;
}

Assistant:

static int internal_verify(X509_STORE_CTX *ctx) {
  // TODO(davidben): This logic is incredibly confusing. Rewrite this:
  //
  // First, don't allow the verify callback to suppress
  // X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY, which will simplify the
  // signature check. Then replace jumping into the middle of the loop. It's
  // trying to ensure that all certificates see |check_cert_time|, then checking
  // the root's self signature when requested, but not breaking partial chains
  // in the process.
  int n = (int)sk_X509_num(ctx->chain);
  ctx->error_depth = n - 1;
  n--;
  X509 *xi = sk_X509_value(ctx->chain, n);
  X509 *xs;
  if (x509_check_issued_with_callback(ctx, xi, xi)) {
    xs = xi;
  } else {
    if (ctx->param->flags & X509_V_FLAG_PARTIAL_CHAIN) {
      xs = xi;
      goto check_cert;
    }
    if (n <= 0) {
      ctx->error = X509_V_ERR_UNABLE_TO_VERIFY_LEAF_SIGNATURE;
      ctx->current_cert = xi;
      return call_verify_cb(0, ctx);
    }
    n--;
    ctx->error_depth = n;
    xs = sk_X509_value(ctx->chain, n);
  }

  //      ctx->error=0;  not needed
  while (n >= 0) {
    ctx->error_depth = n;

    // Skip signature check for self signed certificates unless
    // explicitly asked for. It doesn't add any security and just wastes
    // time.
    if (xs != xi || (ctx->param->flags & X509_V_FLAG_CHECK_SS_SIGNATURE)) {
      EVP_PKEY *pkey = X509_get0_pubkey(xi);
      if (pkey == NULL) {
        ctx->error = X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY;
        ctx->current_cert = xi;
        if (!call_verify_cb(0, ctx)) {
          return 0;
        }
      } else if (X509_verify(xs, pkey) <= 0) {
        ctx->error = X509_V_ERR_CERT_SIGNATURE_FAILURE;
        ctx->current_cert = xs;
        if (!call_verify_cb(0, ctx)) {
          return 0;
        }
      }
    }

  check_cert:
    if (!check_cert_time(ctx, xs)) {
      return 0;
    }

    // The last error (if any) is still in the error value
    ctx->current_cert = xs;
    if (!call_verify_cb(1, ctx)) {
      return 0;
    }

    n--;
    if (n >= 0) {
      xi = xs;
      xs = sk_X509_value(ctx->chain, n);
    }
  }

  return 1;
}